

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

_Bool verify_level(chunk_conflict *c)

{
  _Bool _Var1;
  square *psVar2;
  monster *pmVar3;
  object *poVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  loc grid;
  long lVar8;
  uint local_6c;
  uint local_68;
  uint local_64;
  ulong local_60;
  loc_conflict local_58;
  ulong local_50;
  loc_conflict local_48;
  ulong local_40;
  loc_conflict local_38;
  
  lVar8 = 0;
  local_38 = loc(0,0);
  local_40 = (ulong)local_38 >> 0x20;
  local_48 = loc(0,0);
  local_50 = (ulong)local_48 >> 0x20;
  local_58 = loc(0,0);
  local_60 = (ulong)local_58 >> 0x20;
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  for (uVar7 = 0; (long)uVar7 < (long)c->height; uVar7 = uVar7 + 1) {
    for (uVar5 = 0; (long)uVar5 < (long)c->width; uVar5 = uVar5 + 1) {
      if ((uVar5 == 0 || uVar7 == 0) || (uVar5 == c->width - 1 || uVar7 == c->height - 1)) {
        grid = (loc)(uVar7 << 0x20 | uVar5);
        psVar2 = square(c,(loc)(lVar8 + uVar5));
        if (FEAT_PERM != (uint)psVar2->feat) {
          local_64 = local_64 + 1;
          local_40 = uVar7 & 0xffffffff;
          local_38 = (loc_conflict)(uVar5 & 0xffffffff);
        }
      }
      else {
        grid = (loc)(lVar8 + uVar5);
      }
      pmVar3 = square_monster(c,grid);
      if (pmVar3 != (monster *)0x0) {
        _Var1 = square_is_monster_walkable(c,grid);
        if (!_Var1) {
          local_68 = local_68 + 1;
          local_50 = uVar7 & 0xffffffff;
          local_48 = (loc_conflict)(uVar5 & 0xffffffff);
        }
      }
      poVar4 = square_object(c,grid);
      if (poVar4 != (object *)0x0) {
        _Var1 = square_isobjectholding(c,grid);
        if (!_Var1) {
          local_6c = local_6c + 1;
          local_60 = uVar7 & 0xffffffff;
          local_58 = (loc_conflict)(uVar5 & 0xffffffff);
        }
      }
    }
    lVar8 = lVar8 + 0x100000000;
  }
  if ((local_64 != 0 || local_68 != 0) || local_6c != 0) {
    if (local_64 == 0) {
      if (local_68 == 0) {
        psVar2 = square(c,(loc)((ulong)local_58 & 0xffffffff | local_60 << 0x20));
        uVar5 = (ulong)psVar2->feat;
        pcVar6 = "Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d";
        uVar7 = (ulong)local_6c;
        local_38 = local_58;
        local_40 = local_60;
      }
      else {
        psVar2 = square(c,(loc)((ulong)local_48 & 0xffffffff | local_50 << 0x20));
        uVar5 = (ulong)psVar2->feat;
        pcVar6 = "Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d";
        uVar7 = (ulong)local_68;
        local_38 = local_48;
        local_40 = local_50;
      }
    }
    else {
      psVar2 = square(c,(loc)((ulong)local_38 & 0xffffffff | local_40 << 0x20));
      uVar5 = (ulong)psVar2->feat;
      pcVar6 = "Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d";
      uVar7 = (ulong)local_64;
    }
    pcVar6 = format(pcVar6,uVar7,(ulong)local_38 & 0xffffffff,local_40,uVar5);
    dump_level_simple((char *)0x0,pcVar6,c);
    msg("Restarting wilderness generation; bad level in dumpedlevel.html");
  }
  return (local_64 == 0 && local_68 == 0) && local_6c == 0;
}

Assistant:

static bool verify_level(struct chunk *c)
{
	struct loc last_bad_bnd = loc(0, 0);
	struct loc last_bad_mon = loc(0, 0);
	struct loc last_bad_obj = loc(0, 0);
	int broken_bnd = 0, broken_mon = 0, broken_obj = 0;
	struct loc grid;

	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if ((grid.y == 0 || grid.x == 0
					|| grid.y == c->height - 1
					|| grid.x == c->width - 1)
					&& square(c, grid)->feat != FEAT_PERM) {
				++broken_bnd;
				last_bad_bnd = grid;
			}
			if (square_monster(c, grid)
					&& !square_is_monster_walkable(c, grid)) {
				++broken_mon;
				last_bad_mon = grid;
			}
			if (square_object(c, grid)
					&& !square_isobjectholding(c, grid)) {
				++broken_obj;
				last_bad_obj = grid;
			}
		}
	}

	if (broken_bnd || broken_mon || broken_obj) {
		const char *title;

		if (broken_bnd) {
			title = format("Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d",
				broken_bnd, last_bad_bnd.x, last_bad_bnd.y,
				(int) square(c, last_bad_bnd)->feat);
		} else if (broken_mon) {
			title = format("Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_mon, last_bad_mon.x, last_bad_mon.y,
				(int) square(c, last_bad_mon)->feat);
		} else {
			title = format("Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_obj, last_bad_obj.x, last_bad_obj.y,
				(int) square(c, last_bad_obj)->feat);
		}
		dump_level_simple(NULL, title, c);
		msg("Restarting wilderness generation; bad level in dumpedlevel.html");
		return false;
	}
	return true;
}